

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t *
Abc_NtkStartFromWithLatches(Abc_Ntk_t *pNtk,Abc_NtkType_t Type,Abc_NtkFunc_t Func,int nLatches)

{
  Abc_Ntk_t *pNtk_00;
  char *pcVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Vec_Vec_t *pVVar6;
  Abc_Cex_t *pAVar7;
  Vec_Int_t *pVVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  else {
    if (pNtk->nObjCounts[8] != 0) {
      __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                    ,0xb9,
                    "Abc_Ntk_t *Abc_NtkStartFromWithLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t, int)"
                   );
    }
    pNtk_00 = Abc_NtkAlloc(Type,Func,1);
    iVar9 = pNtk->nBarBufs;
    pNtk_00->nConstrs = pNtk->nConstrs;
    pNtk_00->nBarBufs = iVar9;
    pcVar1 = Extra_UtilStrsav(pNtk->pName);
    pNtk_00->pName = pcVar1;
    pcVar1 = Extra_UtilStrsav(pNtk->pSpec);
    pNtk_00->pSpec = pcVar1;
    Abc_NtkCleanCopy(pNtk);
    if ((pNtk->ntkType == ABC_NTK_STRASH) && (pNtk_00->ntkType == ABC_NTK_STRASH)) {
      pAVar2 = Abc_AigConst1(pNtk_00);
      pAVar3 = Abc_AigConst1(pNtk);
      (pAVar3->field_6).pCopy = pAVar2;
    }
    for (iVar9 = 0; iVar9 < pNtk->vPis->nSize - nLatches; iVar9 = iVar9 + 1) {
      pAVar2 = Abc_NtkPi(pNtk,iVar9);
      Abc_NtkDupObj(pNtk_00,pAVar2,(uint)(Type != ABC_NTK_NETLIST));
    }
    for (iVar9 = 0; iVar9 < pNtk->vPos->nSize - nLatches; iVar9 = iVar9 + 1) {
      pAVar2 = Abc_NtkPo(pNtk,iVar9);
      Abc_NtkDupObj(pNtk_00,pAVar2,(uint)(Type != ABC_NTK_NETLIST));
    }
    iVar9 = 0;
    if (0 < nLatches) {
      iVar9 = nLatches;
    }
    iVar10 = -nLatches;
    while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
      pAVar2 = Abc_NtkCreateLatch(pNtk_00);
      Abc_LatchSetInit0(pAVar2);
      pAVar3 = Abc_NtkCreateBi(pNtk_00);
      pAVar4 = Abc_NtkPo(pNtk,pNtk->vPos->nSize + iVar10);
      (pAVar4->field_6).pCopy = pAVar3;
      pAVar4 = Abc_NtkCreateBo(pNtk_00);
      pAVar5 = Abc_NtkPi(pNtk,pNtk->vPis->nSize + iVar10);
      (pAVar5->field_6).pCopy = pAVar4;
      Abc_ObjAddFanin(pAVar2,pAVar3);
      Abc_ObjAddFanin(pAVar4,pAVar2);
      pcVar1 = Abc_ObjName(pAVar3);
      Abc_ObjAssignName(pAVar3,pcVar1,(char *)0x0);
      pcVar1 = Abc_ObjName(pAVar4);
      Abc_ObjAssignName(pAVar4,pcVar1,(char *)0x0);
      iVar10 = iVar10 + 1;
    }
    Abc_ManTimeDup(pNtk,pNtk_00);
    if ((Vec_Vec_t *)pNtk->vOnehots != (Vec_Vec_t *)0x0) {
      pVVar6 = Vec_VecDupInt((Vec_Vec_t *)pNtk->vOnehots);
      pNtk_00->vOnehots = (Vec_Ptr_t *)pVVar6;
    }
    if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
      pAVar7 = Abc_CexDup(pNtk->pSeqModel,pNtk->nObjCounts[8]);
      pNtk_00->pSeqModel = pAVar7;
    }
    if (pNtk->vObjPerm != (Vec_Int_t *)0x0) {
      pVVar8 = Vec_IntDup(pNtk->vObjPerm);
      pNtk_00->vObjPerm = pVVar8;
    }
    fVar13 = pNtk->AndGateDelay;
    pNtk_00->AndGateDelay = fVar13;
    if ((((fVar13 != 0.0) || (NAN(fVar13))) && (pNtk->pManTime != (Abc_ManTime_t *)0x0)) &&
       ((Type == ABC_NTK_STRASH && (pNtk->ntkType != ABC_NTK_STRASH)))) {
      for (iVar9 = 0; iVar9 < pNtk->vCis->nSize; iVar9 = iVar9 + 1) {
        pAVar2 = Abc_NtkCi(pNtk,iVar9);
        fVar12 = Abc_NodeReadArrivalWorst(pAVar2);
        fVar13 = 0.0;
        if (0.0 <= fVar12) {
          fVar13 = fVar12;
        }
        *(uint *)((long)(pAVar2->field_6).pTemp + 0x14) =
             *(uint *)((long)(pAVar2->field_6).pTemp + 0x14) & 0xfff |
             (int)(fVar13 / pNtk->AndGateDelay) << 0xc;
      }
    }
    if (pNtk->vCis->nSize != pNtk_00->vCis->nSize) {
      __assert_fail("Abc_NtkCiNum(pNtk) == Abc_NtkCiNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                    ,0xee,
                    "Abc_Ntk_t *Abc_NtkStartFromWithLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t, int)"
                   );
    }
    if (pNtk->vCos->nSize != pNtk_00->vCos->nSize) {
      __assert_fail("Abc_NtkCoNum(pNtk) == Abc_NtkCoNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                    ,0xef,
                    "Abc_Ntk_t *Abc_NtkStartFromWithLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t, int)"
                   );
    }
    if (pNtk_00->nObjCounts[8] != nLatches) {
      __assert_fail("nLatches == Abc_NtkLatchNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                    ,0xf0,
                    "Abc_Ntk_t *Abc_NtkStartFromWithLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t, int)"
                   );
    }
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkStartFromWithLatches( Abc_Ntk_t * pNtk, Abc_NtkType_t Type, Abc_NtkFunc_t Func, int nLatches )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pNode0, * pNode1;
    int fCopyNames, i;
    if ( pNtk == NULL )
        return NULL;
    assert( Abc_NtkLatchNum(pNtk) == 0 );
    // decide whether to copy the names
    fCopyNames = ( Type != ABC_NTK_NETLIST );
    // start the network
    pNtkNew = Abc_NtkAlloc( Type, Func, 1 );
    pNtkNew->nConstrs   = pNtk->nConstrs;
    pNtkNew->nBarBufs   = pNtk->nBarBufs;
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
    if ( Abc_NtkIsStrash(pNtk) && Abc_NtkIsStrash(pNtkNew) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    for ( i = 0; i < Abc_NtkPiNum(pNtk)-nLatches; i++ )
        Abc_NtkDupObj( pNtkNew, Abc_NtkPi(pNtk, i), fCopyNames );
    for ( i = 0; i < Abc_NtkPoNum(pNtk)-nLatches; i++ )
        Abc_NtkDupObj( pNtkNew, Abc_NtkPo(pNtk, i), fCopyNames );
    for ( i = 0; i < nLatches; i++ )
    {
        pObj = Abc_NtkCreateLatch(pNtkNew);
        Abc_LatchSetInit0( pObj );
        pNode0 = Abc_NtkCreateBi(pNtkNew);
        Abc_NtkPo(pNtk, Abc_NtkPoNum(pNtk)-nLatches+i)->pCopy = pNode0;
        pNode1 = Abc_NtkCreateBo(pNtkNew);
        Abc_NtkPi(pNtk, Abc_NtkPiNum(pNtk)-nLatches+i)->pCopy = pNode1;
        Abc_ObjAddFanin( pObj, pNode0 );
        Abc_ObjAddFanin( pNode1, pObj );
        Abc_ObjAssignName( pNode0, Abc_ObjName(pNode0), NULL );
        Abc_ObjAssignName( pNode1, Abc_ObjName(pNode1), NULL );
    }
    // transfer logic level
//    Abc_NtkForEachCi( pNtk, pObj, i )
//        pObj->pCopy->Level = pObj->Level;
    // transfer the names
//    Abc_NtkTrasferNames( pNtk, pNtkNew );
    Abc_ManTimeDup( pNtk, pNtkNew );
    if ( pNtk->vOnehots )
        pNtkNew->vOnehots = (Vec_Ptr_t *)Vec_VecDupInt( (Vec_Vec_t *)pNtk->vOnehots );
    if ( pNtk->pSeqModel )
        pNtkNew->pSeqModel = Abc_CexDup( pNtk->pSeqModel, Abc_NtkLatchNum(pNtk) );
    if ( pNtk->vObjPerm )
        pNtkNew->vObjPerm = Vec_IntDup( pNtk->vObjPerm );
    pNtkNew->AndGateDelay = pNtk->AndGateDelay;
    // initialize logic level of the CIs
    if ( pNtk->AndGateDelay != 0.0 && pNtk->pManTime != NULL && pNtk->ntkType != ABC_NTK_STRASH && Type == ABC_NTK_STRASH )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->pCopy->Level = (int)(Abc_MaxFloat(0, Abc_NodeReadArrivalWorst(pObj)) / pNtk->AndGateDelay);
    }
    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkCiNum(pNtk)    == Abc_NtkCiNum(pNtkNew) );
    assert( Abc_NtkCoNum(pNtk)    == Abc_NtkCoNum(pNtkNew) );
    assert( nLatches              == Abc_NtkLatchNum(pNtkNew) );
    return pNtkNew;
}